

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

string * Path::enforce_protocol(string *__return_storage_ptr__,string *path)

{
  ulong uVar1;
  allocator local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  size_type index;
  string *local_18;
  string *path_local;
  
  local_18 = path;
  path_local = __return_storage_ptr__;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_28 = std::__cxx11::string::find((char *)local_18,0x3ca8d5);
    if (local_28 == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_48,"file://",&local_49);
      std::operator+(__return_storage_ptr__,&local_48,local_18);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_18);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"",(allocator *)((long)&index + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&index + 7));
  }
  return __return_storage_ptr__;
}

Assistant:

string enforce_protocol(const string &path)
{
	if (path.empty())
		return "";

	auto index = path.find("://");
	if (index == string::npos)
		return string("file://") + path;
	else
		return path;
}